

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int createCollation(sqlite3 *db,char *zName,u8 enc,void *pCtx,
                   _func_int_void_ptr_int_void_ptr_int_void_ptr *xCompare,_func_void_void_ptr *xDel)

{
  byte enc_00;
  CollSeq *pCVar1;
  void *pvVar2;
  CollSeq *p;
  int j;
  CollSeq *aColl;
  int enc2;
  CollSeq *pColl;
  _func_void_void_ptr *xDel_local;
  _func_int_void_ptr_int_void_ptr_int_void_ptr *xCompare_local;
  void *pCtx_local;
  u8 enc_local;
  char *zName_local;
  sqlite3 *db_local;
  
  if ((enc == '\x04') || (enc_00 = enc, enc == '\b')) {
    enc_00 = 2;
  }
  if ((enc_00 == 0) || (3 < enc_00)) {
    db_local._4_4_ = sqlite3MisuseError(0x25e6e);
  }
  else {
    pCVar1 = sqlite3FindCollSeq(db,enc_00,zName,0);
    if ((pCVar1 != (CollSeq *)0x0) &&
       (pCVar1->xCmp != (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0)) {
      if (db->nVdbeActive != 0) {
        sqlite3ErrorWithMsg(db,5,
                            "unable to delete/modify collation sequence due to active statements");
        return 5;
      }
      sqlite3ExpirePreparedStatements(db,0);
      if ((pCVar1->enc & 0xf7) == enc_00) {
        pvVar2 = sqlite3HashFind(&db->aCollSeq,zName);
        for (p._4_4_ = 0; p._4_4_ < 3; p._4_4_ = p._4_4_ + 1) {
          if (*(u8 *)((long)pvVar2 + (long)p._4_4_ * 0x28 + 8) == pCVar1->enc) {
            if (*(long *)((long)pvVar2 + (long)p._4_4_ * 0x28 + 0x20) != 0) {
              (**(code **)((long)pvVar2 + (long)p._4_4_ * 0x28 + 0x20))
                        (*(undefined8 *)((long)pvVar2 + (long)p._4_4_ * 0x28 + 0x10));
            }
            *(undefined8 *)((long)pvVar2 + (long)p._4_4_ * 0x28 + 0x18) = 0;
          }
        }
      }
    }
    pCVar1 = sqlite3FindCollSeq(db,enc_00,zName,1);
    if (pCVar1 == (CollSeq *)0x0) {
      db_local._4_4_ = 7;
    }
    else {
      pCVar1->xCmp = xCompare;
      pCVar1->pUser = pCtx;
      pCVar1->xDel = xDel;
      pCVar1->enc = enc_00 | enc & 8;
      sqlite3Error(db,0);
      db_local._4_4_ = 0;
    }
  }
  return db_local._4_4_;
}

Assistant:

static int createCollation(
  sqlite3* db,
  const char *zName, 
  u8 enc,
  void* pCtx,
  int(*xCompare)(void*,int,const void*,int,const void*),
  void(*xDel)(void*)
){
  CollSeq *pColl;
  int enc2;
  
  assert( sqlite3_mutex_held(db->mutex) );

  /* If SQLITE_UTF16 is specified as the encoding type, transform this
  ** to one of SQLITE_UTF16LE or SQLITE_UTF16BE using the
  ** SQLITE_UTF16NATIVE macro. SQLITE_UTF16 is not used internally.
  */
  enc2 = enc;
  testcase( enc2==SQLITE_UTF16 );
  testcase( enc2==SQLITE_UTF16_ALIGNED );
  if( enc2==SQLITE_UTF16 || enc2==SQLITE_UTF16_ALIGNED ){
    enc2 = SQLITE_UTF16NATIVE;
  }
  if( enc2<SQLITE_UTF8 || enc2>SQLITE_UTF16BE ){
    return SQLITE_MISUSE_BKPT;
  }

  /* Check if this call is removing or replacing an existing collation 
  ** sequence. If so, and there are active VMs, return busy. If there
  ** are no active VMs, invalidate any pre-compiled statements.
  */
  pColl = sqlite3FindCollSeq(db, (u8)enc2, zName, 0);
  if( pColl && pColl->xCmp ){
    if( db->nVdbeActive ){
      sqlite3ErrorWithMsg(db, SQLITE_BUSY, 
        "unable to delete/modify collation sequence due to active statements");
      return SQLITE_BUSY;
    }
    sqlite3ExpirePreparedStatements(db, 0);

    /* If collation sequence pColl was created directly by a call to
    ** sqlite3_create_collation, and not generated by synthCollSeq(),
    ** then any copies made by synthCollSeq() need to be invalidated.
    ** Also, collation destructor - CollSeq.xDel() - function may need
    ** to be called.
    */ 
    if( (pColl->enc & ~SQLITE_UTF16_ALIGNED)==enc2 ){
      CollSeq *aColl = sqlite3HashFind(&db->aCollSeq, zName);
      int j;
      for(j=0; j<3; j++){
        CollSeq *p = &aColl[j];
        if( p->enc==pColl->enc ){
          if( p->xDel ){
            p->xDel(p->pUser);
          }
          p->xCmp = 0;
        }
      }
    }
  }

  pColl = sqlite3FindCollSeq(db, (u8)enc2, zName, 1);
  if( pColl==0 ) return SQLITE_NOMEM_BKPT;
  pColl->xCmp = xCompare;
  pColl->pUser = pCtx;
  pColl->xDel = xDel;
  pColl->enc = (u8)(enc2 | (enc & SQLITE_UTF16_ALIGNED));
  sqlite3Error(db, SQLITE_OK);
  return SQLITE_OK;
}